

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess_test.cc
# Opt level: O3

void __thiscall SubprocessTestTokenAvailable::Run(SubprocessTestTokenAvailable *this)

{
  SubprocessSet *this_00;
  TestTokenPool *tokens;
  _Map_pointer pppSVar1;
  Test *pTVar2;
  bool bVar3;
  int iVar4;
  ExitStatus EVar5;
  Subprocess *this_01;
  ssize_t sVar6;
  string *psVar7;
  char token;
  int fds [2];
  undefined1 local_51;
  string local_50;
  
  this_00 = &(this->super_SubprocessTest).subprocs_;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"ls /","");
  this_01 = SubprocessSet::Add(this_00,&local_50,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  bVar3 = testing::Test::Check
                    (g_current_test,this_01 != (Subprocess *)0x0,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                     ,0x135,"(Subprocess *) 0 != subproc");
  pTVar2 = g_current_test;
  if (bVar3) {
    iVar4 = pipe((int *)&local_50);
    bVar3 = testing::Test::Check
                      (pTVar2,iVar4 == 0,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                       ,0x13c,"0u == pipe(fds)");
    if (bVar3) {
      (this->super_SubprocessTest).tokens_._fd = (int)local_50._M_dataplus._M_p;
      pTVar2 = g_current_test;
      sVar6 = write(local_50._M_dataplus._M_p._4_4_,"T",1);
      bVar3 = testing::Test::Check
                        (pTVar2,sVar6 == 1,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                         ,0x13e,"1u == write(fds[1], \"T\", 1)");
      if (bVar3) {
        tokens = &(this->super_SubprocessTest).tokens_;
        (this->super_SubprocessTest).subprocs_.token_available_ = false;
        SubprocessSet::DoWork(this_00,&tokens->super_TokenPool);
        testing::Test::Check
                  (g_current_test,(this->super_SubprocessTest).subprocs_.token_available_,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                   ,0x14c,"subprocs_.IsTokenAvailable()");
        pppSVar1 = *(_Map_pointer *)
                    ((long)&(this->super_SubprocessTest).subprocs_.finished_.c.
                            super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
                            super__Deque_impl_data + 0x48);
        testing::Test::Check
                  (g_current_test,
                   ((long)*(_Elt_pointer *)
                           ((long)&(this->super_SubprocessTest).subprocs_.finished_.c.
                                   super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>.
                                   _M_impl.super__Deque_impl_data + 0x20) -
                    (long)((iterator *)
                          ((long)&(this->super_SubprocessTest).subprocs_.finished_.c.
                                  super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>.
                                  _M_impl.super__Deque_impl_data + 0x10))->_M_cur >> 3) +
                   ((long)((iterator *)
                          ((long)&(this->super_SubprocessTest).subprocs_.finished_.c.
                                  super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>.
                                  _M_impl.super__Deque_impl_data + 0x30))->_M_cur -
                    (long)*(_Elt_pointer *)
                           ((long)&(this->super_SubprocessTest).subprocs_.finished_.c.
                                   super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>.
                                   _M_impl.super__Deque_impl_data + 0x38) >> 3) +
                   ((((ulong)((long)pppSVar1 -
                             (long)*(_Map_pointer *)
                                    ((long)&(this->super_SubprocessTest).subprocs_.finished_.c.
                                            super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>
                                            ._M_impl.super__Deque_impl_data + 0x28)) >> 3) - 1) +
                   (ulong)(pppSVar1 == (_Map_pointer)0x0)) * 0x40 == 0,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                   ,0x14d,"0u == subprocs_.finished_.size()");
        pTVar2 = g_current_test;
        sVar6 = read((int)local_50._M_dataplus._M_p,&local_51,1);
        bVar3 = testing::Test::Check
                          (pTVar2,sVar6 == 1,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                           ,0x152,"1u == read(fds[0], &token, 1)");
        if (bVar3) {
          while (bVar3 = Subprocess::Done(this_01), !bVar3) {
            SubprocessSet::DoWork(this_00,&tokens->super_TokenPool);
          }
          close(local_50._M_dataplus._M_p._4_4_);
          close((int)local_50._M_dataplus._M_p);
          pTVar2 = g_current_test;
          EVar5 = Subprocess::Finish(this_01);
          testing::Test::Check
                    (pTVar2,EVar5 == ExitSuccess,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                     ,0x15e,"ExitSuccess == subproc->Finish()");
          pTVar2 = g_current_test;
          psVar7 = Subprocess::GetOutput_abi_cxx11_(this_01);
          iVar4 = std::__cxx11::string::compare((char *)psVar7);
          testing::Test::Check
                    (pTVar2,iVar4 != 0,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                     ,0x15f,"\"\" != subproc->GetOutput()");
          pppSVar1 = *(_Map_pointer *)
                      ((long)&(this->super_SubprocessTest).subprocs_.finished_.c.
                              super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl
                              .super__Deque_impl_data + 0x48);
          testing::Test::Check
                    (g_current_test,
                     ((long)*(_Elt_pointer *)
                             ((long)&(this->super_SubprocessTest).subprocs_.finished_.c.
                                     super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>.
                                     _M_impl.super__Deque_impl_data + 0x20) -
                      (long)((iterator *)
                            ((long)&(this->super_SubprocessTest).subprocs_.finished_.c.
                                    super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>.
                                    _M_impl.super__Deque_impl_data + 0x10))->_M_cur >> 3) +
                     ((long)((iterator *)
                            ((long)&(this->super_SubprocessTest).subprocs_.finished_.c.
                                    super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>.
                                    _M_impl.super__Deque_impl_data + 0x30))->_M_cur -
                      (long)*(_Elt_pointer *)
                             ((long)&(this->super_SubprocessTest).subprocs_.finished_.c.
                                     super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>.
                                     _M_impl.super__Deque_impl_data + 0x38) >> 3) +
                     ((((ulong)((long)pppSVar1 -
                               (long)*(_Map_pointer *)
                                      ((long)&(this->super_SubprocessTest).subprocs_.finished_.c.
                                              super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>
                                              ._M_impl.super__Deque_impl_data + 0x28)) >> 3) - 1) +
                     (ulong)(pppSVar1 == (_Map_pointer)0x0)) * 0x40 == 1,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                     ,0x161,"1u == subprocs_.finished_.size()");
          return;
        }
      }
    }
  }
  g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  return;
}

Assistant:

TEST_F(SubprocessTest, TokenAvailable) {
  Subprocess* subproc = subprocs_.Add(kSimpleCommand);
  ASSERT_NE((Subprocess *) 0, subproc);

  // simulate GNUmake jobserver pipe with 1 token
#ifdef _WIN32
  tokens_._token_available = true;
#else
  int fds[2];
  ASSERT_EQ(0u, pipe(fds));
  tokens_._fd = fds[0];
  ASSERT_EQ(1u, write(fds[1], "T", 1));
#endif

  subprocs_.ResetTokenAvailable();
  subprocs_.DoWork(&tokens_);
#ifdef _WIN32
  tokens_._token_available = false;
  // we need to loop here as we have no conrol where the token
  // I/O completion post ends up in the queue
  while (!subproc->Done() && !subprocs_.IsTokenAvailable()) {
    subprocs_.DoWork(&tokens_);
  }
#endif

  EXPECT_TRUE(subprocs_.IsTokenAvailable());
  EXPECT_EQ(0u, subprocs_.finished_.size());

  // remove token to let DoWork() wait for command again
#ifndef _WIN32
  char token;
  ASSERT_EQ(1u, read(fds[0], &token, 1));
#endif

  while (!subproc->Done()) {
    subprocs_.DoWork(&tokens_);
  }

#ifndef _WIN32
  close(fds[1]);
  close(fds[0]);
#endif

  EXPECT_EQ(ExitSuccess, subproc->Finish());
  EXPECT_NE("", subproc->GetOutput());

  EXPECT_EQ(1u, subprocs_.finished_.size());
}